

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

string * booster::log::sinks::format_plain_text_message_abi_cxx11_(message *msg)

{
  level_type level;
  int iVar1;
  time_put *ptVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined1 extraout_DL;
  message *in_RSI;
  string *in_RDI;
  ptime pVar5;
  tm formatted;
  ptime now;
  ostringstream ss;
  ios_base *in_stack_fffffffffffffd28;
  ptime *in_stack_fffffffffffffd30;
  message *in_stack_fffffffffffffd38;
  ostreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd40;
  message *in_stack_fffffffffffffd48;
  string local_240 [32];
  undefined8 local_220;
  undefined1 local_218;
  undefined8 local_210;
  undefined4 local_208;
  locale local_200;
  undefined1 local_1f8 [56];
  longlong local_1c0;
  int local_1b8;
  longlong local_1b0;
  int local_1a8;
  locale local_190;
  long local_188 [47];
  message *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::locale::classic();
  std::ios::imbue(&local_190);
  std::locale::~locale(&local_190);
  pVar5 = ptime::now();
  local_1c0 = pVar5.sec;
  local_1b8 = pVar5.nsec;
  local_1b0 = local_1c0;
  local_1a8 = local_1b8;
  ptime::local_time(in_stack_fffffffffffffd30);
  std::ios_base::getloc(in_stack_fffffffffffffd28);
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&local_200);
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            (in_stack_fffffffffffffd40,(ostream_type *)in_stack_fffffffffffffd38);
  local_220 = std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
                        (ptVar2,local_210,local_208,
                         (long)local_188 + *(long *)(local_188[0] + -0x18),0x20,local_1f8,
                         "%Y-%m-%d %H:%M:%S; ","");
  local_218 = extraout_DL;
  std::locale::~locale(&local_200);
  pcVar3 = message::module(local_10);
  poVar4 = std::operator<<((ostream *)local_188,pcVar3);
  poVar4 = std::operator<<(poVar4,", ");
  level = message::level(local_10);
  pcVar3 = logger::level_to_string(level);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,": ");
  message::log_message_abi_cxx11_(in_stack_fffffffffffffd38);
  std::operator<<(poVar4,local_240);
  std::__cxx11::string::~string(local_240);
  poVar4 = std::operator<<((ostream *)local_188," (");
  pcVar3 = message::file_name(in_stack_fffffffffffffd48);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,":");
  iVar1 = message::file_line(local_10);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return in_RDI;
}

Assistant:

std::string format_plain_text_message(message const &msg)
		{
			std::ostringstream ss;
			ss.imbue(std::locale::classic());
			ptime now = ptime::now();
			std::tm formatted = ptime::local_time(now);
			static char const format[]="%Y-%m-%d %H:%M:%S; ";
			std::use_facet<std::time_put<char> >(ss.getloc()).put(ss,ss,' ',&formatted,format,format+sizeof(format)-1);
			ss << msg.module()<<", " << logger::level_to_string(msg.level()) << ": " << msg.log_message();

			ss <<" (" << msg.file_name() <<":" <<msg.file_line() <<")";
			return ss.str();
		}